

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::ReadFontCollection(uint8_t *data,size_t len,FontCollection *font_collection)

{
  bool bVar1;
  reference font_00;
  Font *font;
  Buffer file;
  FontCollection *font_collection_local;
  size_t len_local;
  uint8_t *data_local;
  
  file.offset_ = (size_t)font_collection;
  Buffer::Buffer((Buffer *)&font,data,len);
  bVar1 = Buffer::ReadU32((Buffer *)&font,(uint32_t *)file.offset_);
  if (bVar1) {
    if (*(int *)file.offset_ == 0x74746366) {
      data_local._7_1_ =
           ReadTrueTypeCollection((Buffer *)&font,data,len,(FontCollection *)file.offset_);
    }
    else {
      std::vector<woff2::Font,_std::allocator<woff2::Font>_>::resize
                ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)(file.offset_ + 0x38),1);
      font_00 = std::vector<woff2::Font,_std::allocator<woff2::Font>_>::operator[]
                          ((vector<woff2::Font,_std::allocator<woff2::Font>_> *)
                           (file.offset_ + 0x38),0);
      font_00->flavor = *(uint32_t *)file.offset_;
      data_local._7_1_ = ReadTrueTypeFont((Buffer *)&font,data,len,font_00);
    }
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool ReadFontCollection(const uint8_t* data, size_t len,
                        FontCollection* font_collection) {
  Buffer file(data, len);

  if (!file.ReadU32(&font_collection->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (font_collection->flavor != kTtcFontFlavor) {
    font_collection->fonts.resize(1);
    Font& font = font_collection->fonts[0];
    font.flavor = font_collection->flavor;
    return ReadTrueTypeFont(&file, data, len, &font);
  }
  return ReadTrueTypeCollection(&file, data, len, font_collection);
}